

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong
helper_dextr_r_w_mips64el(target_ulong ac,target_ulong shift,CPUMIPSState_conflict5 *env)

{
  ulong uStack_38;
  uint32_t temp128;
  uint64_t temp [3];
  CPUMIPSState_conflict5 *env_local;
  target_ulong shift_local;
  target_ulong ac_local;
  
  temp[2] = (uint64_t)env;
  mipsdsp_rndrashift_acc(&stack0xffffffffffffffc8,(uint32_t)ac,(uint)shift & 0x3f,env);
  uStack_38 = uStack_38 + 1;
  if ((uStack_38 == 0) && (temp[0] = temp[0] + 1, temp[0] == 0)) {
    temp[1] = temp[1] + 1;
  }
  if ((((temp[1] & 1) != 0) || (temp[0] != 0)) &&
     ((((uint)temp[1] & 1) != 1 || (temp[0] != 0xffffffffffffffff)))) {
    set_DSPControl_overflow_flag(1,0x17,(CPUMIPSState_conflict5 *)temp[2]);
  }
  return (long)(int)(uStack_38 >> 1);
}

Assistant:

target_ulong helper_dextr_r_w(target_ulong ac, target_ulong shift,
                              CPUMIPSState *env)
{
    uint64_t temp[3];
    uint32_t temp128;

    shift = shift & 0x3F;
    mipsdsp_rndrashift_acc(temp, ac, shift, env);

    temp[0] += 1;
    if (temp[0] == 0) {
        temp[1] += 1;
        if (temp[1] == 0) {
            temp[2] += 1;
        }
    }

    temp128 = temp[2] & 0x01;

    if ((temp128 != 0 || temp[1] != 0) &&
       (temp128 != 1 || temp[1] != ~0ull)) {
        set_DSPControl_overflow_flag(1, 23, env);
    }

    return (int64_t)(int32_t)(temp[0] >> 1);
}